

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O2

int tokthset1(void *ctx0,toksdef *sym,mcmon objn)

{
  ushort *puVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  if (sym->tokslen == *(byte *)((long)ctx0 + 0xe)) {
    iVar3 = bcmp(sym->toksnam,(void *)((long)ctx0 + 0xf),(ulong)sym->tokslen);
    if (iVar3 == 0) {
      sym->toksval = *(ushort *)((long)ctx0 + 10);
      sym->tokstyp = *(uchar *)((long)ctx0 + 8);
      uVar2 = *(ushort *)
               ((*(undefined8 **)((long)ctx0 + 0x40))[(ulong)(objn >> 8) + 6] +
               (ulong)(objn & 0xff) * 2);
      puVar1 = (ushort *)
               (*(long *)(*(long *)**(undefined8 **)((long)ctx0 + 0x40) + (ulong)(uVar2 >> 8) * 8) +
                0x14 + (ulong)((uVar2 & 0xff) << 5));
      *puVar1 = *puVar1 | 1;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int tokthset1(void *ctx0, toksdef *sym, mcmon objn)
{
    tokseadef *ctx = (tokseadef *)ctx0;
    
    if (sym->tokslen == ctx->tokseasym.tokslen
        && !memcmp(sym->toksnam, ctx->tokseasym.toksnam,
                   ctx->tokseasym.tokslen))
    {
        sym->toksval = ctx->tokseasym.toksval;
        sym->tokstyp = ctx->tokseasym.tokstyp;
            
        /* touch object, since it's been changed */
        mcmtch(ctx->tokseamctx, objn);
        return(TRUE);
    }
    else
        return(FALSE);
}